

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

_Bool monster_damage_target(melee_effect_handler_context_t *context,_Bool no_further_monster_effect)

{
  _Bool _Var1;
  wchar_t damage;
  byte local_22;
  _Bool dead;
  wchar_t reduced;
  _Bool no_further_monster_effect_local;
  melee_effect_handler_context_t *context_local;
  
  if (context->p == (player *)0x0) {
    display_blow_message_vs_monster(context->method,context->m_name,context->t_mon->midx);
    _Var1 = mon_take_nonplayer_hit(context->damage,context->t_mon,MON_MSG_NONE,MON_MSG_DIE);
    local_22 = 1;
    if (!_Var1) {
      local_22 = no_further_monster_effect;
    }
    context_local._7_1_ = (_Bool)(local_22 & 1);
  }
  else {
    damage = player_apply_damage_reduction(context->p,context->damage);
    display_blow_message_vs_player(context->method,context->m_name,context->p,damage);
    take_hit(context->p,damage,context->ddesc);
    if ((context->p->is_dead & 1U) == 0) {
      context_local._7_1_ = false;
    }
    else {
      context_local._7_1_ = true;
    }
  }
  return context_local._7_1_;
}

Assistant:

static bool monster_damage_target(melee_effect_handler_context_t *context,
								  bool no_further_monster_effect)
{
	/* Take damage */
	if (context->p) {
		/*
		 * Player damage reduction does not affect the damage used for
		 * side effect calculations so leave context->damage as is.
		 */
		int reduced = player_apply_damage_reduction(context->p,
			context->damage);

		display_blow_message_vs_player(context->method, context->m_name,
			context->p, reduced);
		take_hit(context->p, reduced, context->ddesc);
		if (context->p->is_dead) return true;
	} else {
		bool dead;

		display_blow_message_vs_monster(context->method,
			context->m_name, context->t_mon->midx);
		dead = mon_take_nonplayer_hit(context->damage, context->t_mon,
			MON_MSG_NONE, MON_MSG_DIE);
		return (dead || no_further_monster_effect);
	}
	return false;
}